

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.c
# Opt level: O2

IceTImage icetReduceCompose(void)

{
  ulong uVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  IceTSizeType height;
  IceTBoolean IVar5;
  int iVar6;
  IceTSizeType IVar7;
  IceTInt *pIVar8;
  IceTInt *pIVar9;
  IceTVoid *pIVar10;
  IceTVoid *pIVar11;
  IceTVoid *__s;
  IceTVoid *pIVar12;
  IceTSparseImage IVar13;
  IceTSparseImage IVar14;
  IceTSparseImage IVar15;
  IceTImage IVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  IceTSizeType piece_offset_00;
  int iVar24;
  long lVar25;
  int *piVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  IceTBoolean *pIVar30;
  int iVar31;
  IceTVoid *pIVar32;
  IceTSizeType *pIVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  IceTInt num_processes;
  IceTSparseImage composited_image;
  int local_84;
  IceTInt *local_80;
  IceTInt local_74;
  IceTImage local_70;
  undefined8 local_68;
  IceTSizeType piece_offset;
  IceTVoid *local_58;
  long local_50;
  IceTInt *local_48;
  IceTSparseImage rendered_image;
  
  local_80 = (IceTInt *)icetUnsafeStateGetBoolean(0x89);
  pIVar8 = icetUnsafeStateGetInteger(0x8a);
  icetGetIntegerv(0x8b,(IceTInt *)&rendered_image);
  pIVar9 = icetUnsafeStateGetInteger(0x1a);
  local_48 = icetUnsafeStateGetInteger(0x29);
  icetGetIntegerv(0x10,(IceTInt *)&composited_image);
  icetGetIntegerv(3,&num_processes);
  icetGetIntegerv(2,&local_84);
  if ((int)rendered_image.opaque_internals < 1) {
    uVar28 = 0xffffffffffffffff;
    local_70.opaque_internals = (IceTInt *)0x0;
    local_80 = (IceTInt *)0x0;
    local_68 = (IceTBoolean *)((ulong)local_68._4_4_ << 0x20);
    local_74 = 0;
  }
  else {
    pIVar10 = icetGetStateBuffer(0x1a5,(uint)composited_image.opaque_internals << 2);
    pIVar11 = icetGetStateBuffer(0x1a6,num_processes << 2);
    local_58 = icetGetStateBuffer(0x1a7,(uint)composited_image.opaque_internals * num_processes * 4)
    ;
    __s = icetGetStateBuffer(0x1a8,(uint)composited_image.opaque_internals << 2);
    local_70.opaque_internals =
         icetGetStateBuffer(0x1a9,(uint)composited_image.opaque_internals << 2);
    pIVar12 = icetGetStateBuffer(0x1aa,num_processes << 2);
    iVar17 = 0;
    for (lVar25 = 0; lVar25 < (int)(uint)composited_image.opaque_internals; lVar25 = lVar25 + 1) {
      iVar24 = pIVar8[lVar25];
      iVar6 = (num_processes * iVar24) / (int)rendered_image.opaque_internals;
      iVar31 = iVar6;
      if (iVar6 < 2) {
        iVar31 = 1;
      }
      if (0 < iVar24) {
        iVar6 = iVar31;
      }
      if (iVar24 <= iVar6) {
        iVar6 = iVar24;
      }
      *(int *)((long)pIVar10 + lVar25 * 4) = iVar6;
      iVar17 = iVar17 + iVar6;
    }
    for (; iVar17 < num_processes; iVar17 = iVar17 + 1) {
      uVar19 = 0;
      for (uVar28 = 1; lVar25 = (long)(int)uVar19,
          (long)uVar28 < (long)(int)(uint)composited_image.opaque_internals; uVar28 = uVar28 + 1) {
        iVar24 = *(int *)((long)pIVar10 + uVar28 * 4);
        if (iVar24 < pIVar8[uVar28]) {
          iVar6 = *(int *)((long)pIVar10 + lVar25 * 4);
          if ((iVar6 == pIVar8[lVar25]) ||
             (auVar34._0_4_ = (float)pIVar8[lVar25], auVar34._4_4_ = (float)pIVar8[uVar28],
             auVar34._8_8_ = 0, auVar36._0_4_ = (float)iVar6, auVar36._4_4_ = (float)iVar24,
             auVar36._8_8_ = 0, auVar34 = divps(auVar34,auVar36), auVar34._0_4_ < auVar34._4_4_)) {
            uVar19 = uVar28 & 0xffffffff;
          }
        }
      }
      iVar24 = *(int *)((long)pIVar10 + lVar25 * 4);
      if (pIVar8[lVar25] <= iVar24) break;
      *(int *)((long)pIVar10 + lVar25 * 4) = iVar24 + 1;
    }
    for (; num_processes < iVar17; iVar17 = iVar17 + -1) {
      uVar19 = 0;
      for (uVar28 = 1; lVar25 = (long)(int)uVar19,
          (long)uVar28 < (long)(int)(uint)composited_image.opaque_internals; uVar28 = uVar28 + 1) {
        iVar24 = *(int *)((long)pIVar10 + uVar28 * 4);
        if ((1 < iVar24) &&
           ((uVar18 = *(uint *)((long)pIVar10 + lVar25 * 4), (int)uVar18 < 2 ||
            (auVar37._4_4_ = 0, auVar37._0_4_ = uVar18, auVar37._8_4_ = iVar24, auVar37._12_4_ = 0,
            auVar35._0_4_ = (float)(SUB168(auVar37 | _DAT_0011c040,0) - (double)DAT_0011c040),
            auVar35._4_4_ = (float)(SUB168(auVar37 | _DAT_0011c040,8) - DAT_0011c040._8_8_),
            auVar35._8_8_ = 0, auVar38._0_4_ = (float)pIVar8[lVar25],
            auVar38._4_4_ = (float)pIVar8[uVar28], auVar38._8_8_ = 0,
            auVar34 = divps(auVar38,auVar35), auVar34._4_4_ < auVar34._0_4_)))) {
          uVar19 = uVar28 & 0xffffffff;
        }
      }
      piVar2 = (int *)((long)pIVar10 + lVar25 * 4);
      *piVar2 = *piVar2 + -1;
    }
    memset(__s,0,(long)(int)(uint)composited_image.opaque_internals << 2);
    for (lVar25 = 0; lVar25 < num_processes; lVar25 = lVar25 + 1) {
      *(undefined4 *)((long)pIVar11 + lVar25 * 4) = 0xffffffff;
    }
    for (lVar25 = 0; lVar25 < (int)(uint)composited_image.opaque_internals; lVar25 = lVar25 + 1) {
      if (0 < pIVar8[lVar25]) {
        *(int *)((long)pIVar11 + (long)pIVar9[lVar25] * 4) = (int)lVar25;
        *(IceTInt *)
         ((long)local_58 +
         ((long)*(int *)((long)__s + lVar25 * 4) + (long)(int)lVar25 * (long)num_processes) * 4) =
             pIVar9[lVar25];
        piVar2 = (int *)((long)__s + lVar25 * 4);
        *piVar2 = *piVar2 + 1;
      }
    }
    for (lVar25 = 0; lVar25 < num_processes; lVar25 = lVar25 + 1) {
      if (*(int *)((long)pIVar11 + lVar25 * 4) < 0) {
        uVar28 = 0;
        if (0 < (int)(uint)composited_image.opaque_internals) {
          uVar28 = (ulong)(uint)composited_image.opaque_internals;
        }
        for (uVar19 = 0; uVar28 != uVar19; uVar19 = uVar19 + 1) {
          if ((*(IceTBoolean *)
                ((long)local_80 +
                uVar19 + (long)(int)((uint)composited_image.opaque_internals * (int)lVar25)) != '\0'
              ) && (*(int *)((long)__s + uVar19 * 4) < *(int *)((long)pIVar10 + uVar19 * 4))) {
            *(int *)((long)pIVar11 + lVar25 * 4) = (int)uVar19;
            *(int *)((long)local_58 +
                    ((long)*(int *)((long)__s + uVar19 * 4) +
                    (long)(int)uVar19 * (long)num_processes) * 4) = (int)lVar25;
            piVar2 = (int *)((long)__s + uVar19 * 4);
            *piVar2 = *piVar2 + 1;
            break;
          }
        }
      }
    }
    iVar17 = 0;
    for (lVar25 = 0; uVar28 = (ulong)(int)(uint)composited_image.opaque_internals,
        lVar25 < (long)uVar28; lVar25 = lVar25 + 1) {
      iVar24 = *(int *)((long)__s + lVar25 * 4);
      while (iVar24 < *(int *)((long)pIVar10 + lVar25 * 4)) {
        lVar21 = (long)iVar17;
        iVar17 = iVar17 + -1;
        piVar2 = (int *)(lVar21 * 4 + (long)pIVar11);
        do {
          piVar26 = piVar2;
          iVar17 = iVar17 + 1;
          piVar2 = piVar26 + 1;
        } while (-1 < *piVar26);
        *piVar26 = (int)lVar25;
        *(int *)((long)local_58 +
                ((long)*(int *)((long)__s + lVar25 * 4) + (long)num_processes * (long)(int)lVar25) *
                4) = iVar17;
        iVar24 = *(int *)((long)__s + lVar25 * 4) + 1;
        *(int *)((long)__s + lVar25 * 4) = iVar24;
      }
    }
    local_68 = (IceTBoolean *)local_80;
    local_50 = 0;
    local_74 = 0;
    pIVar10 = local_58;
    for (uVar19 = 0; (long)uVar19 < (long)(int)uVar28; uVar19 = uVar19 + 1) {
      lVar25 = (long)num_processes;
      if ((uVar19 == *(uint *)((long)pIVar11 + (long)local_84 * 4)) ||
         (pIVar32 = pIVar10,
         *(IceTBoolean *)((long)local_80 + (long)local_84 * (long)(int)uVar28 + uVar19) != '\0')) {
        lVar21 = uVar19 * lVar25;
        IVar5 = icetIsEnabled(0x142);
        pIVar32 = local_58;
        if (IVar5 == '\0') {
          if ((uVar19 == *(uint *)((long)pIVar11 + (long)local_84 * 4)) &&
             (*(IceTBoolean *)
               ((long)local_80 +
               (long)(int)(uint)composited_image.opaque_internals * (long)local_84 + uVar19) != '\0'
             )) {
            *(int *)((long)local_70.opaque_internals + uVar19 * 4) = local_84;
          }
          lVar25 = -1;
          iVar17 = -1;
          iVar24 = 1;
          do {
            uVar28 = (ulong)(uint)composited_image.opaque_internals;
            lVar22 = lVar25;
            do {
              lVar25 = (long)(int)lVar22;
              lVar27 = lVar22 << 0x20;
              pIVar30 = local_68 + (lVar25 + 1) * (long)(int)(uint)composited_image.opaque_internals
              ;
              do {
                lVar25 = lVar25 + 1;
                if (num_processes <= lVar25) goto LAB_001147be;
                lVar27 = lVar27 + 0x100000000;
                IVar5 = *pIVar30;
                pIVar30 = pIVar30 + (int)(uint)composited_image.opaque_internals;
              } while (IVar5 == '\0');
              lVar22 = lVar25;
            } while (uVar19 == *(uint *)((long)pIVar11 + (lVar27 >> 0x1e)));
            iVar6 = *(int *)((long)__s + uVar19 * 4);
            iVar31 = iVar24;
            do {
              iVar20 = iVar17 + 1;
              iVar24 = 0;
              iVar17 = iVar20;
              if (iVar6 <= iVar20) {
                iVar17 = iVar24;
              }
              iVar4 = *(int *)((long)pIVar10 + (long)iVar17 * 4 + lVar21 * 4);
            } while ((((iVar20 < iVar6) && (iVar31 != 0)) &&
                     (iVar24 = iVar31,
                     *(IceTBoolean *)
                      ((long)local_80 +
                      (long)(int)(iVar4 * (uint)composited_image.opaque_internals) + uVar19) != '\0'
                     )) && (iVar31 = 1, uVar19 == *(uint *)((long)pIVar11 + (long)iVar4 * 4)));
            if (local_84 == (int)lVar25) {
              *(int *)((long)local_70.opaque_internals + uVar19 * 4) = iVar4;
            }
          } while( true );
        }
        uVar18 = 0;
        for (lVar22 = 0; lVar22 < num_processes; lVar22 = lVar22 + 1) {
          if (*(IceTBoolean *)
               ((long)local_80 +
               (long)(int)(uint)composited_image.opaque_internals * (long)local_48[lVar22] + uVar19)
              != '\0') {
            *(IceTInt *)((long)pIVar12 + (long)(int)uVar18 * 4) = local_48[lVar22];
            uVar18 = uVar18 + 1;
          }
        }
        uVar28 = 0;
        if (0 < (int)uVar18) {
          uVar28 = (ulong)uVar18;
        }
        lVar25 = lVar25 * local_50;
        for (uVar29 = 0; uVar29 != uVar28; uVar29 = uVar29 + 1) {
          uVar3 = *(uint *)((long)__s + uVar19 * 4);
          iVar17 = *(int *)((long)pIVar12 + uVar29 * 4);
          uVar23 = (ulong)uVar3;
          if (uVar19 == *(uint *)((long)pIVar11 + (long)iVar17 * 4)) {
            do {
              if ((int)uVar23 < 1) goto LAB_00114644;
              uVar1 = uVar23 - 1;
              lVar22 = uVar23 * 4;
              uVar23 = uVar1;
            } while (*(int *)((long)local_58 + lVar22 + lVar25 + -4) != iVar17);
            lVar22 = (long)((int)((int)uVar29 * uVar3) / (int)uVar18);
            *(undefined4 *)((long)local_58 + uVar1 * 4 + lVar25) =
                 *(undefined4 *)((long)pIVar10 + lVar22 * 4 + lVar21 * 4);
            *(int *)((long)pIVar10 + lVar22 * 4 + lVar21 * 4) = iVar17;
          }
LAB_00114644:
        }
        if (uVar19 == *(uint *)((long)pIVar11 + (long)local_84 * 4)) {
          uVar3 = *(uint *)((long)__s + uVar19 * 4);
          uVar29 = (ulong)uVar3;
          if ((int)uVar3 < 1) {
            uVar29 = 0;
          }
          for (uVar23 = 0; uVar29 != uVar23; uVar23 = uVar23 + 1) {
            if (*(int *)((long)local_58 + uVar23 * 4 + lVar25) == pIVar9[uVar19]) {
              local_74 = (IceTInt)uVar23;
              break;
            }
          }
        }
        for (uVar29 = 0; uVar28 != uVar29; uVar29 = uVar29 + 1) {
          if (*(int *)((long)pIVar12 + uVar29 * 4) == local_84) {
            *(IceTInt *)((long)local_70.opaque_internals + uVar19 * 4) =
                 *(IceTInt *)
                  ((long)pIVar10 +
                  (long)((*(int *)((long)__s + uVar19 * 4) * (int)uVar29) / (int)uVar18) * 4 +
                  lVar21 * 4);
          }
        }
        uVar28 = (ulong)(uint)composited_image.opaque_internals;
      }
LAB_001147be:
      local_50 = local_50 + 4;
      local_68 = local_68 + 1;
      pIVar10 = pIVar32;
    }
    uVar28 = (ulong)*(int *)((long)pIVar11 + (long)local_84 * 4);
    if ((long)uVar28 < 0) {
      local_80 = (IceTInt *)0x0;
      local_68 = (IceTBoolean *)((ulong)local_68._4_4_ << 0x20);
      local_74 = 0;
    }
    else {
      local_80 = (IceTInt *)((long)pIVar10 + (long)num_processes * uVar28 * 4);
      local_68 = (IceTBoolean *)CONCAT44(local_68._4_4_,*(undefined4 *)((long)__s + uVar28 * 4));
    }
  }
  icetGetIntegerv(0x13,(IceTInt *)&composited_image);
  icetGetIntegerv(0x14,&num_processes);
  IVar7 = icetSparseImageBufferSize((uint)composited_image.opaque_internals,num_processes);
  pIVar10 = icetGetStateBuffer(0x1a1,IVar7);
  IVar13 = icetGetStateBufferSparseImage
                     (0x1a0,(uint)composited_image.opaque_internals,num_processes);
  IVar14 = icetGetStateBufferSparseImage
                     (0x1a2,(uint)composited_image.opaque_internals,num_processes);
  IVar15 = icetGetStateBufferSparseImage
                     (0x1a3,(uint)composited_image.opaque_internals,num_processes);
  icetRenderTransferSparseImages
            (IVar14,IVar15,pIVar10,IVar13,(IceTInt *)local_70.opaque_internals,&rendered_image);
  iVar17 = (int)uVar28;
  if (-1 < iVar17) {
    IVar13.opaque_internals._4_4_ = rendered_image.opaque_internals._4_4_;
    IVar13.opaque_internals._0_4_ = (int)rendered_image.opaque_internals;
    icetSingleImageCompose
              (local_80,(IceTInt)local_68,local_74,IVar13,&composited_image,&piece_offset);
  }
  IVar5 = icetIsEnabled(0x146);
  if (IVar5 == '\0') {
    IVar14.opaque_internals._4_4_ = composited_image.opaque_internals._4_4_;
    IVar14.opaque_internals._0_4_ = (uint)composited_image.opaque_internals;
    IVar7 = icetSparseImageGetNumPixels(IVar14);
    pIVar8 = icetUnsafeStateGetInteger(0x11);
    if (IVar7 < 1) {
      IVar16 = icetImageNull();
      icetStateSetInteger(0x8c,-1);
      icetStateSetInteger(0x8d,0);
      IVar7 = 0;
    }
    else {
      IVar16 = icetGetStateBufferImage(0x1a0,pIVar8[(long)iVar17 + 2],pIVar8[(long)iVar17 + 3]);
      IVar15.opaque_internals._4_4_ = composited_image.opaque_internals._4_4_;
      IVar15.opaque_internals._0_4_ = (uint)composited_image.opaque_internals;
      icetDecompressSubImage(IVar15,piece_offset,IVar16);
      icetStateSetInteger(0x8c,iVar17);
      icetStateSetInteger(0x8d,piece_offset);
    }
    icetStateSetInteger(0x8e,IVar7);
  }
  else {
    local_50 = CONCAT44(local_50._4_4_,piece_offset);
    local_58 = (IceTVoid *)
               CONCAT44(composited_image.opaque_internals._4_4_,
                        (uint)composited_image.opaque_internals);
    icetGetIntegerv(0x1b,&num_processes);
    icetGetIntegerv(0x10,&local_84);
    pIVar8 = icetUnsafeStateGetInteger(0x11);
    local_80 = icetUnsafeStateGetInteger(0x1a);
    local_70 = icetImageNull();
    local_68 = (IceTBoolean *)(uVar28 & 0xffffffff);
    pIVar33 = pIVar8 + 3;
    local_48 = (IceTInt *)uVar28;
    for (uVar19 = 0; (long)uVar19 < (long)local_84; uVar19 = uVar19 + 1) {
      IVar7 = pIVar33[-1];
      height = *pIVar33;
      if (local_68 == (IceTBoolean *)uVar19) {
        IVar13.opaque_internals = local_58;
        piece_offset_00 = (IceTSizeType)local_50;
        if (num_processes == (int)local_48) {
LAB_001149c6:
          IVar16 = icetGetStateBufferImage(0x1a0,IVar7,height);
          local_70 = IVar16;
        }
        else {
          IVar16 = icetGetStateBufferImage(0x1a1,IVar7,height);
          IVar13.opaque_internals = local_58;
          piece_offset_00 = (IceTSizeType)local_50;
        }
      }
      else {
        IVar13 = icetSparseImageNull();
        piece_offset_00 = 0;
        if (uVar19 == (uint)num_processes) goto LAB_001149c6;
        piece_offset_00 = 0;
        IVar16 = icetImageNull();
      }
      icetSingleImageCollect(IVar13,local_80[uVar19],piece_offset_00,IVar16);
      pIVar33 = pIVar33 + 4;
    }
    icetGetIntegerv(0x1b,&num_processes);
    IVar16.opaque_internals = local_70.opaque_internals;
    if ((-1 < num_processes) && (num_processes != (int)local_48)) {
      icetClearImage(local_70);
    }
  }
  return (IceTImage)IVar16.opaque_internals;
}

Assistant:

static IceTInt reduceDelegate(IceTInt **tile_image_destp,
                              IceTInt **compose_groupp,
                              IceTInt *group_sizep,
                              IceTInt *group_image_destp)
{
    const IceTBoolean *all_contained_tiles_masks;
    const IceTInt *contrib_counts;
    IceTInt total_image_count;

    IceTInt num_tiles;
    IceTInt num_processes;
    IceTInt rank;
    const IceTInt *tile_display_nodes;
    const IceTInt *composite_order;

    IceTInt *num_proc_for_tile;
    IceTInt *node_assignment;
    IceTInt *tile_proc_groups;
    IceTInt *group_sizes;
    IceTInt *tile_image_dest;
    IceTInt group_image_dest = 0;
    IceTInt *contributors;

    IceTInt pcount;

    IceTInt tile, node;
    IceTInt snode, rnode, dest;
    IceTInt piece;
    IceTInt first_loop;

    all_contained_tiles_masks
        = icetUnsafeStateGetBoolean(ICET_ALL_CONTAINED_TILES_MASKS);
    contrib_counts = icetUnsafeStateGetInteger(ICET_TILE_CONTRIB_COUNTS);
    icetGetIntegerv(ICET_TOTAL_IMAGE_COUNT, &total_image_count);
    tile_display_nodes = icetUnsafeStateGetInteger(ICET_DISPLAY_NODES);
    composite_order = icetUnsafeStateGetInteger(ICET_COMPOSITE_ORDER);

    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);
    icetGetIntegerv(ICET_NUM_PROCESSES, &num_processes);
    icetGetIntegerv(ICET_RANK, &rank);

    if (total_image_count < 1) {
        icetRaiseDebug("No nodes are drawing.");
        *tile_image_destp = NULL;
        *compose_groupp = NULL;
        *group_sizep = 0;
        *group_image_destp = 0;
        return -1;
    }

    num_proc_for_tile = icetGetStateBuffer(REDUCE_NUM_PROC_FOR_TILE_BUFFER,
                                           num_tiles * sizeof(IceTInt));
    node_assignment   = icetGetStateBuffer(REDUCE_NODE_ASSIGNMENT_BUFFER,
                                           num_processes * sizeof(IceTInt));
    tile_proc_groups  = icetGetStateBuffer(REDUCE_TILE_PROC_GROUPS_BUFFER,
                                             num_tiles * num_processes
                                           * sizeof(IceTInt));
    group_sizes       = icetGetStateBuffer(REDUCE_GROUP_SIZES_BUFFER,
                                           num_tiles * sizeof(IceTInt));
    tile_image_dest   = icetGetStateBuffer(REDUCE_TILE_IMAGE_DEST_BUFFER,
                                           num_tiles * sizeof(IceTInt));
    contributors      = icetGetStateBuffer(REDUCE_CONTRIBUTORS_BUFFER,
                                           num_processes * sizeof(IceTInt));

  /* Decide the minimum amount of processes that should be added to each
     tile. */
    pcount = 0;
    for (tile = 0; tile < num_tiles; tile++) {
        IceTInt allocate = (contrib_counts[tile]*num_processes)/total_image_count;
      /* Make sure at least one process is assigned to tiles that have at
         least one image. */
        if ((allocate < 1) && (contrib_counts[tile] > 0)) allocate = 1;
      /* Don't allocate more processes to a tile than images for that
         tile. */
        if (allocate > contrib_counts[tile]) allocate = contrib_counts[tile];

        num_proc_for_tile[tile] = allocate;

      /* Keep track of how many processes have been allocated. */
        pcount += allocate;
    }

  /* Handle when we have not allocated all the processes. */
    while (num_processes > pcount) {
      /* Find the tile with the largest image to process ratio that
         can still have a process added to it. */
        IceTInt max = 0;
        for (tile = 1; tile < num_tiles; tile++) {
            if (   (num_proc_for_tile[tile] < contrib_counts[tile])
                && (   (num_proc_for_tile[max] == contrib_counts[max])
                    || (  (float)contrib_counts[max]/num_proc_for_tile[max]
                        < (float)contrib_counts[tile]/num_proc_for_tile[tile])))
            {
                max = tile;
            }
        }
        if (num_proc_for_tile[max] < contrib_counts[max]) {
            num_proc_for_tile[max]++;
            pcount++;
        } else {
          /* Cannot assign any more processes. */
            break;
        }
    }

  /* Handle when we have allocated too many processes. */
    while (num_processes < pcount) {
      /* Find tile with the smallest image to process ratio that can still
         have a process removed. */
        IceTInt min = 0;
        for (tile = 1; tile < num_tiles; tile++) {
            if (   (num_proc_for_tile[tile] > 1)
                && (   (num_proc_for_tile[min] < 2)
                    || (  (float)contrib_counts[min]/num_proc_for_tile[min]
                        > (float)contrib_counts[tile]/num_proc_for_tile[tile])))
            {
                min = tile;
            }
        }
        num_proc_for_tile[min]--;
        pcount--;
    }

  /* Clear out arrays. */
    memset(group_sizes, 0, num_tiles*sizeof(IceTInt));
    for (node = 0; node < num_processes; node++) {
        node_assignment[node] = -1;
    }

#define ASSIGN_NODE2TILE(node, tile)                                    \
node_assignment[(node)] = (tile);                                       \
tile_proc_groups[(tile)*num_processes + group_sizes[(tile)]] = (node);  \
group_sizes[(tile)]++;

  /* Assign each display node to the group processing that tile if there
     are any images in that tile. */
    for (tile = 0; tile < num_tiles; tile++) {
        if (contrib_counts[tile] > 0) {
            ASSIGN_NODE2TILE(tile_display_nodes[tile], tile);
        }
    }

  /* Assign each node to a tile it is rendering, if possible. */
    for (node = 0; node < num_processes; node++) {
        if (node_assignment[node] < 0) {
            const IceTBoolean *tile_mask
                = all_contained_tiles_masks + node*num_tiles;
            for (tile = 0; tile < num_tiles; tile++) {
                if (   (tile_mask[tile])
                    && (group_sizes[tile] < num_proc_for_tile[tile])) {
                    ASSIGN_NODE2TILE(node, tile);
                    break;
                }
            }
        }
    }

  /* Assign rest of the nodes. */
    node = 0;
    for (tile = 0; tile < num_tiles; tile++) {
        while (group_sizes[tile] < num_proc_for_tile[tile]) {
            while (node_assignment[node] >= 0) node++;
            ASSIGN_NODE2TILE(node, tile);
        }
    }

  /* Now figure out who I am sending to and how many I am receiving. */
    for (tile = 0; tile < num_tiles; tile++) {
        IceTInt *proc_group = tile_proc_groups + tile*num_processes;

        if (   (node_assignment[rank] != tile)
            && !all_contained_tiles_masks[rank*num_tiles + tile]) {
          /* Not involved with this tile.  Skip it. */
            continue;
        }

        if (!icetIsEnabled(ICET_ORDERED_COMPOSITE)) {
          /* If we are not doing an ordered composite, then we are free
           * to assign processes to images in any way we please.  Here we
           * will do everything we can to minimize communication. */

          /* First, have processes send images to themselves when possible. */
            if (   (node_assignment[rank] == tile)
                && all_contained_tiles_masks[rank*num_tiles + tile]) {
                tile_image_dest[tile] = rank;
            }

            snode = -1;
            rnode = -1;
            first_loop = 1;
            while (1) {
              /* Find next process that still needs a place to send images. */
                do {
                    snode++;
                } while (   (snode < num_processes)
                         && !all_contained_tiles_masks[snode*num_tiles + tile]);
                if (snode >= num_processes) {
                  /* We must be finished. */
                    break;
                }
                if (node_assignment[snode] == tile) {
                  /* This node keeps image in itself. */
                    continue;
                }

              /* Find the next process that can accept the image. */
                do {
                    rnode++;
                    if (rnode >= group_sizes[tile]) {
                        rnode = 0;
                        first_loop = 0;
                    }
                    dest = proc_group[rnode];
                } while (   first_loop
                         && all_contained_tiles_masks[dest*num_tiles + tile]
                         && (node_assignment[dest] == tile));

              /* Check to see if this node is sending the image data. */
                if (snode == rank) {
                    tile_image_dest[tile] = dest;
                }
            }
        } else {
          /* We are doing an ordered composite.  It is vital that each process
           * gets images that are consecutive in the ordering.  Communication
           * costs come second. */

            IceTInt num_contributors = 0;
            int i;
          /* First, we make a list of all processes contributing to this
           * tile in the order in which the images need to be composed.
           * We will then split this list into contiguous chunks and assign
           * each chunk to a process. */
            for (i = 0; i < num_processes; i++) {
                snode = composite_order[i];
                if (all_contained_tiles_masks[snode*num_tiles + tile]) {
                  /* The process snode contains an image for this tile.
                   * Add it to compositors. */
                    contributors[num_contributors] = snode;
                    num_contributors++;
                }
            }
#ifdef DEBUG
            if (num_contributors != contrib_counts[tile]) {
                icetRaiseError("Miscounted number of tile contributions",
                               ICET_SANITY_CHECK_FAIL);
            }
#endif

          /* contributors is split up as evenly as possible.  We will
           * assign nodes in the order they appear in proc_group.  We now
           * re-order proc_group to minimize the communications. */
            for (i = 0; i < num_contributors; i++) {
                piece = i*group_sizes[tile]/num_contributors;
                snode = contributors[i];
                if (node_assignment[snode] == tile) {
                  /* snode is part of this group.  Assign it to piece it is
                   * part of. */
                    int j;
                    for (j = group_sizes[tile]-1; j >=0; j--) {
                        if (proc_group[j] == snode) {
                          /* Found snode in proc_group.  Place it at
                           * "piece" in proc_group. */
                            proc_group[j] = proc_group[piece];
                            proc_group[piece] = snode;
                            break;
                        }
                    }
#ifdef DEBUG
                    if (j < 0) {
                        icetRaiseError("node_assignment/proc_group mismatch",
                                       ICET_SANITY_CHECK_FAIL);
                    }
#endif
                }
            }

          /* We have just shuffled proc_group, so the tile display node is
           * no longer necessarily at 0.  Find out where it should be. */
            if (node_assignment[rank] == tile) {
                for (i = 0; i < group_sizes[tile]; i++) {
                    if (proc_group[i] == tile_display_nodes[tile]) {
                        group_image_dest = i;
                        break;
                    }
                }
#ifdef DEBUG
                if (i == group_sizes[tile]) {
                    icetRaiseError("Display process not participating in tile?",
                                   ICET_SANITY_CHECK_FAIL);
                }
#endif
            }

          /* Assign nodes in the order they appear in proc_group. */
            for (i = 0; i < num_contributors; i++) {
                piece = i*group_sizes[tile]/num_contributors;
                snode = contributors[i];
                rnode = proc_group[piece];
                
              /* Check to see if this node is sending the image data. */
                if (snode == rank) {
                    tile_image_dest[tile] = rnode;
                }
            }
        }
    }

    *tile_image_destp = tile_image_dest;
    if (node_assignment[rank] < 0) {
        *compose_groupp = NULL;
        *group_sizep = 0;
        *group_image_destp = 0;
    } else {
        *compose_groupp = tile_proc_groups+node_assignment[rank]*num_processes;
        *group_sizep = group_sizes[node_assignment[rank]];
        *group_image_destp = group_image_dest;
    }
    return node_assignment[rank];
}